

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall slang::driver::Driver::parseCommandLine(Driver *this,string_view argList)

{
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view sVar2;
  string_view fmt;
  format_args args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180 [2];
  string local_170;
  string_view local_150;
  iterator local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err;
  iterator __end3;
  iterator __begin3;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  *local_118;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  *__range3;
  Driver *local_108;
  char *local_100;
  Driver *local_f8;
  Driver *this_local;
  string_view argList_local;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d8 [3];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  char *local_a8;
  iterator local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  string *local_88;
  char *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  char *pcStack_60;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  char *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_18;
  char *local_10;
  
  local_100 = argList._M_str;
  local_108 = (Driver *)argList._M_len;
  local_f8 = this;
  this_local = local_108;
  argList_local._M_len = (size_t)local_100;
  CommandLine::ParseOptions::ParseOptions((ParseOptions *)((long)&__range3 + 4));
  sVar2._M_str = local_100;
  sVar2._M_len = (size_t)local_108;
  bVar1 = CommandLine::parse(&this->cmdLine,sVar2,__range3._4_4_);
  if (bVar1) {
    argList_local._M_str._7_1_ = (bool)((this->anyFailedLoads ^ 0xffU) & 1);
  }
  else {
    ___begin3 = CommandLine::getErrors_abi_cxx11_(&this->cmdLine);
    local_118 = (span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
                 *)&__begin3;
    __end3 = nonstd::span_lite::
             span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
             ::begin(local_118);
    err = nonstd::span_lite::
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
          ::end(local_118);
    for (; __end3 != err; __end3 = __end3 + 1) {
      local_140 = __end3;
      local_78 = local_180;
      local_80 = "{}\n";
      local_20 = "{}\n";
      local_180[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6d8716;
      local_18 = local_78;
      local_a8 = (char *)std::char_traits<char>::length("{}\n");
      local_10 = local_80;
      local_98 = local_180[0];
      local_a0 = local_140;
      local_70 = &local_98;
      local_b0 = local_180[0];
      pcStack_90 = local_a8;
      local_88 = &local_170;
      local_68 = local_b0;
      pcStack_60 = local_a8;
      local_d8[0] = ::fmt::v9::
                    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string_const&>
                              ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_140,(v9 *)&local_170,local_180[0]);
      local_48 = local_c0;
      local_50 = local_d8;
      local_30 = 0xd;
      fmt.size_ = 0xd;
      fmt.data_ = local_a8;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_50;
      local_40 = local_50;
      local_38 = local_50;
      local_28 = local_48;
      ::fmt::v9::vformat_abi_cxx11_(&local_170,(v9 *)local_b0,fmt,args);
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_170);
      local_150 = sVar2;
      OS::printE(sVar2);
      std::__cxx11::string::~string((string *)&local_170);
    }
    argList_local._M_str._7_1_ = false;
  }
  return argList_local._M_str._7_1_;
}

Assistant:

[[nodiscard]] bool Driver::parseCommandLine(string_view argList) {
    if (!cmdLine.parse(argList)) {
        for (auto& err : cmdLine.getErrors())
            OS::printE(fmt::format("{}\n", err));
        return false;
    }
    return !anyFailedLoads;
}